

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8.h
# Opt level: O0

void ncnn::padding_replicate_pack8_avx(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int x_8;
  int x_7;
  int x_6;
  __m256 _p_2;
  float *ptr0_1;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  __m256 _p_1;
  int y_1;
  int x_2;
  int x_1;
  int x;
  __m256 _p;
  float *ptr0;
  int y;
  float *outptr;
  float *ptr;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 *local_378;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 *local_2f0;
  int local_2e4;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  
  local_2d8 = (undefined8 *)*in_RDI;
  local_2e0 = (undefined8 *)*in_RSI;
  for (local_2e4 = 0; local_2e4 < in_EDX; local_2e4 = local_2e4 + 1) {
    local_320 = *local_2d8;
    uStack_318 = local_2d8[1];
    uStack_310 = local_2d8[2];
    uStack_308 = local_2d8[3];
    for (local_324 = 0; local_324 < in_R8D; local_324 = local_324 + 1) {
      *local_2e0 = local_320;
      local_2e0[1] = uStack_318;
      local_2e0[2] = uStack_310;
      local_2e0[3] = uStack_308;
      local_2e0 = local_2e0 + 4;
    }
    local_2f0 = local_2d8;
    for (local_328 = 0; local_328 < *(int *)((long)in_RDI + 0x2c); local_328 = local_328 + 1) {
      local_320 = *local_2f0;
      uStack_318 = local_2f0[1];
      uStack_310 = local_2f0[2];
      uStack_308 = local_2f0[3];
      *local_2e0 = local_320;
      local_2e0[1] = uStack_318;
      local_2e0[2] = uStack_310;
      local_2e0[3] = uStack_308;
      local_2f0 = local_2f0 + 4;
      local_2e0 = local_2e0 + 4;
    }
    for (local_32c = 0; local_32c < in_R9D; local_32c = local_32c + 1) {
      *local_2e0 = local_320;
      local_2e0[1] = uStack_318;
      local_2e0[2] = uStack_310;
      local_2e0[3] = uStack_308;
      local_2e0 = local_2e0 + 4;
    }
  }
  for (local_330 = 0; local_330 < (int)in_RDI[6]; local_330 = local_330 + 1) {
    local_360 = *local_2d8;
    uStack_358 = local_2d8[1];
    uStack_350 = local_2d8[2];
    uStack_348 = local_2d8[3];
    for (local_364 = 0; local_364 < in_R8D; local_364 = local_364 + 1) {
      *local_2e0 = local_360;
      local_2e0[1] = uStack_358;
      local_2e0[2] = uStack_350;
      local_2e0[3] = uStack_348;
      local_2e0 = local_2e0 + 4;
    }
    for (local_368 = 0; local_368 < *(int *)((long)in_RDI + 0x2c); local_368 = local_368 + 1) {
      local_360 = *local_2d8;
      uStack_358 = local_2d8[1];
      uStack_350 = local_2d8[2];
      uStack_348 = local_2d8[3];
      *local_2e0 = local_360;
      local_2e0[1] = uStack_358;
      local_2e0[2] = uStack_350;
      local_2e0[3] = uStack_348;
      local_2d8 = local_2d8 + 4;
      local_2e0 = local_2e0 + 4;
    }
    for (local_36c = 0; local_36c < in_R9D; local_36c = local_36c + 1) {
      *local_2e0 = local_360;
      local_2e0[1] = uStack_358;
      local_2e0[2] = uStack_350;
      local_2e0[3] = uStack_348;
      local_2e0 = local_2e0 + 4;
    }
  }
  local_2d8 = (undefined8 *)((long)local_2d8 + (long)(*(int *)((long)in_RDI + 0x2c) << 3) * -4);
  for (local_370 = 0; local_370 < in_ECX; local_370 = local_370 + 1) {
    local_3a0 = *local_2d8;
    uStack_398 = local_2d8[1];
    uStack_390 = local_2d8[2];
    uStack_388 = local_2d8[3];
    for (local_3a4 = 0; local_3a4 < in_R8D; local_3a4 = local_3a4 + 1) {
      *local_2e0 = local_3a0;
      local_2e0[1] = uStack_398;
      local_2e0[2] = uStack_390;
      local_2e0[3] = uStack_388;
      local_2e0 = local_2e0 + 4;
    }
    local_378 = local_2d8;
    for (local_3a8 = 0; local_3a8 < *(int *)((long)in_RDI + 0x2c); local_3a8 = local_3a8 + 1) {
      local_3a0 = *local_378;
      uStack_398 = local_378[1];
      uStack_390 = local_378[2];
      uStack_388 = local_378[3];
      *local_2e0 = local_3a0;
      local_2e0[1] = uStack_398;
      local_2e0[2] = uStack_390;
      local_2e0[3] = uStack_388;
      local_378 = local_378 + 4;
      local_2e0 = local_2e0 + 4;
    }
    for (local_3ac = 0; local_3ac < in_R9D; local_3ac = local_3ac + 1) {
      *local_2e0 = local_3a0;
      local_2e0[1] = uStack_398;
      local_2e0[2] = uStack_390;
      local_2e0[3] = uStack_388;
      local_2e0 = local_2e0 + 4;
    }
  }
  return;
}

Assistant:

static void padding_replicate_pack8_avx(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        __m256 _p = _mm256_load_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm256_load_ps(ptr0);
            _mm256_store_ps(outptr, _p);
            ptr0 += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        __m256 _p = _mm256_load_ps(ptr);
        for (int x = 0; x < left; x++)
        {
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm256_load_ps(ptr);
            _mm256_store_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
    }
    // fill bottom
    ptr -= src.w * 8;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        __m256 _p = _mm256_load_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm256_load_ps(ptr0);
            _mm256_store_ps(outptr, _p);
            ptr0 += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
    }
}